

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O0

void alloc_funny_pointers(j_decompress_ptr cinfo)

{
  int iVar1;
  long lVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  long in_RDI;
  JSAMPARRAY xbuf;
  jpeg_component_info *compptr;
  int M;
  int rgroup;
  int ci;
  my_main_ptr main_ptr;
  undefined8 local_28;
  undefined4 local_14;
  
  lVar2 = *(long *)(in_RDI + 0x228);
  iVar1 = *(int *)(in_RDI + 0x1a0);
  uVar4 = (*(code *)**(undefined8 **)(in_RDI + 8))
                    (in_RDI,1,(long)(*(int *)(in_RDI + 0x38) << 1) << 3);
  *(undefined8 *)(lVar2 + 0x68) = uVar4;
  *(long *)(lVar2 + 0x70) = *(long *)(lVar2 + 0x68) + (long)*(int *)(in_RDI + 0x38) * 8;
  local_14 = 0;
  local_28 = *(long *)(in_RDI + 0x130);
  for (; local_14 < *(int *)(in_RDI + 0x38); local_14 = local_14 + 1) {
    iVar3 = (*(int *)(local_28 + 0xc) * *(int *)(local_28 + 0x24)) / *(int *)(in_RDI + 0x1a0);
    lVar5 = (*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,(long)(iVar3 * (iVar1 + 4) * 2) << 3);
    lVar5 = lVar5 + (long)iVar3 * 8;
    *(long *)(*(long *)(lVar2 + 0x68) + (long)local_14 * 8) = lVar5;
    *(long *)(*(long *)(lVar2 + 0x70) + (long)local_14 * 8) =
         lVar5 + (long)(iVar3 * (iVar1 + 4)) * 8;
    local_28 = local_28 + 0x60;
  }
  return;
}

Assistant:

LOCAL(void)
alloc_funny_pointers(j_decompress_ptr cinfo)
/* Allocate space for the funny pointer lists.
 * This is done only once, not once per pass.
 */
{
  my_main_ptr main_ptr = (my_main_ptr)cinfo->main;
  int ci, rgroup;
  int M = cinfo->_min_DCT_scaled_size;
  jpeg_component_info *compptr;
  JSAMPARRAY xbuf;

  /* Get top-level space for component array pointers.
   * We alloc both arrays with one call to save a few cycles.
   */
  main_ptr->xbuffer[0] = (JSAMPIMAGE)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                cinfo->num_components * 2 * sizeof(JSAMPARRAY));
  main_ptr->xbuffer[1] = main_ptr->xbuffer[0] + cinfo->num_components;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    rgroup = (compptr->v_samp_factor * compptr->_DCT_scaled_size) /
      cinfo->_min_DCT_scaled_size; /* height of a row group of component */
    /* Get space for pointer lists --- M+4 row groups in each list.
     * We alloc both pointer lists with one call to save a few cycles.
     */
    xbuf = (JSAMPARRAY)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  2 * (rgroup * (M + 4)) * sizeof(JSAMPROW));
    xbuf += rgroup;             /* want one row group at negative offsets */
    main_ptr->xbuffer[0][ci] = xbuf;
    xbuf += rgroup * (M + 4);
    main_ptr->xbuffer[1][ci] = xbuf;
  }
}